

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RS232Port.h
# Opt level: O1

int WriteAllRS232Port(RS232PORT *pRS232Port,uint8 *writebuf,int writebuflen)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  uint uVar4;
  ulong uVar5;
  
  if (pRS232Port->DevType - 1U < 4) {
    if (0 < writebuflen) {
      iVar1 = pRS232Port->s;
      uVar5 = 0;
      do {
        sVar3 = send(iVar1,writebuf + uVar5,(long)(writebuflen - (int)uVar5),0);
        iVar2 = (int)sVar3;
        if (iVar2 < 0) {
          return 1;
        }
        if (iVar2 == 0) {
          return 2;
        }
        uVar4 = (int)uVar5 + iVar2;
        uVar5 = (ulong)uVar4;
      } while ((int)uVar4 < writebuflen);
    }
  }
  else {
    if (pRS232Port->DevType != 0) {
      return 1;
    }
    if (writebuflen != 0) {
      iVar1 = *(int *)&pRS232Port->hDev;
      uVar5 = 0;
      do {
        sVar3 = write(iVar1,writebuf + uVar5,(ulong)(uint)(writebuflen - (int)uVar5));
        iVar2 = (int)sVar3;
        if (iVar2 < 0) {
          return 1;
        }
        if (iVar2 == 0) {
          return 2;
        }
        uVar4 = (int)uVar5 + iVar2;
        uVar5 = (ulong)uVar4;
      } while (uVar4 < (uint)writebuflen);
    }
  }
  return 0;
}

Assistant:

inline int WriteAllRS232Port(RS232PORT* pRS232Port, uint8* writebuf, int writebuflen)
{
	switch (pRS232Port->DevType)
	{
	case TCP_CLIENT_TYPE_RS232PORT:
	case TCP_SERVER_TYPE_RS232PORT:
	case UDP_CLIENT_TYPE_RS232PORT:
	case UDP_SERVER_TYPE_RS232PORT:
		return sendall(pRS232Port->s, (char*)writebuf, writebuflen);
	case LOCAL_TYPE_RS232PORT:
		return WriteAllComputerRS232Port(pRS232Port->hDev, writebuf, (int)writebuflen);
	default:
		PRINT_DEBUG_ERROR_RS232PORT(("WriteAllRS232Port error (%s) : %s"
			"(pRS232Port=%#x, writebuf=%#x, writebuflen=%d)\n", 
			strtime_m(), 
			"Invalid device type. ", 
			pRS232Port, writebuf, writebuflen));
		return EXIT_FAILURE;
	}
}